

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceLock.cc
# Opt level: O0

LockHandle * __thiscall SDL2pp::Surface::LockHandle::operator=(LockHandle *this,LockHandle *other)

{
  SDL_Surface *pSVar1;
  LockHandle *other_local;
  LockHandle *this_local;
  
  if (other != this) {
    if ((this->surface_ != (Surface *)0x0) &&
       (pSVar1 = Get(this->surface_), (pSVar1->flags & 2) != 0)) {
      pSVar1 = Get(this->surface_);
      SDL_UnlockSurface(pSVar1);
    }
    this->surface_ = other->surface_;
    other->surface_ = (Surface *)0x0;
  }
  return this;
}

Assistant:

Surface::LockHandle& Surface::LockHandle::operator=(Surface::LockHandle&& other) noexcept {
	if (&other == this)
		return *this;

	if (surface_ != nullptr) {
		if (SDL_MUSTLOCK(surface_->Get()))
			SDL_UnlockSurface(surface_->Get());
	}

	surface_ = other.surface_;

	other.surface_ = nullptr;

	return *this;
}